

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

int libtorrent::anon_unknown_1::load_file
              (string *filename,vector<char,_std::allocator<char>_> *v,error_code *ec,
              int max_buffer_size)

{
  pointer __ptr;
  int iVar1;
  int iVar2;
  FILE *__stream;
  size_type __new_size;
  undefined8 uVar3;
  size_t __new_size_00;
  int *piVar4;
  generic_error_category *pgVar5;
  error_code eVar6;
  
  ec->val_ = 0;
  ec->failed_ = false;
  ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
  ;
  __stream = fopen64((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
LAB_00373a3b:
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    ec->val_ = iVar1;
    ec->failed_ = iVar1 != 0;
    pgVar5 = &boost::system::detail::cat_holder<void>::generic_category_instance;
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 < 0) goto LAB_00373a3b;
    __new_size = ftell(__stream);
    if ((long)__new_size < 0) goto LAB_00373a3b;
    if ((long)__new_size <= (long)max_buffer_size) {
      iVar1 = fseek(__stream,0,0);
      if (-1 < iVar1) {
        ::std::vector<char,_std::allocator<char>_>::resize(v,__new_size);
        iVar1 = 0;
        if (__new_size == 0) goto LAB_00373a5c;
        __ptr = (v->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
                ._M_start;
        __new_size_00 =
             fread(__ptr,1,(long)(v->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)__ptr,__stream);
        if (__new_size_00 == __new_size) goto LAB_00373a5c;
        iVar2 = feof(__stream);
        if (iVar2 != 0) {
          ::std::vector<char,_std::allocator<char>_>::resize(v,__new_size_00);
          goto LAB_00373a5c;
        }
      }
      goto LAB_00373a3b;
    }
    eVar6 = errors::make_error_code(metadata_too_large);
    pgVar5 = (generic_error_category *)eVar6.cat_;
    uVar3 = eVar6._0_8_;
    ec->val_ = (int)uVar3;
    ec->failed_ = (bool)(char)((ulong)uVar3 >> 0x20);
    *(int3 *)&ec->field_0x5 = (int3)((ulong)uVar3 >> 0x28);
  }
  ec->cat_ = &pgVar5->super_error_category;
  iVar1 = -1;
LAB_00373a5c:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

int load_file(std::string const& filename, std::vector<char>& v
		, error_code& ec, int const max_buffer_size = 80000000)
	{
		ec.clear();
#ifdef TORRENT_WINDOWS
		aux::file_pointer f(::_wfopen(convert_to_native_path_string(filename).c_str(), L"rb"));
#else
		aux::file_pointer f(std::fopen(filename.c_str(), "rb"));
#endif
		if (f.file() == nullptr)
		{
			ec.assign(errno, generic_category());
			return -1;
		}

		if (std::fseek(f.file(), 0, SEEK_END) < 0)
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		std::int64_t const s = std::ftell(f.file());
		if (s < 0)
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		if (s > max_buffer_size)
		{
			ec = errors::metadata_too_large;
			return -1;
		}
		if (std::fseek(f.file(), 0, SEEK_SET) < 0)
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		v.resize(std::size_t(s));
		if (s == 0) return 0;
		std::size_t const read = std::fread(v.data(), 1, v.size(), f.file());
		if (read != std::size_t(s))
		{
			if (std::feof(f.file()))
			{
				v.resize(read);
				return 0;
			}
			ec.assign(errno, generic_category());
			return -1;
		}
		return 0;
	}